

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

void push_grp_stack(grp_stack *mystack,grp_stack_data data)

{
  grp_stack_item *pgVar1;
  grp_stack_data data_local;
  grp_stack *mystack_local;
  
  if (mystack != (grp_stack *)0x0) {
    pgVar1 = grp_stack_append(mystack->top,data);
    mystack->top = pgVar1;
    mystack->stack_size = mystack->stack_size + 1;
  }
  return;
}

Assistant:

static void push_grp_stack(grp_stack* mystack, grp_stack_data data) {
  if(!mystack) return;
  mystack->top = grp_stack_append(mystack->top, data);
  ++mystack->stack_size;
  return;
}